

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O3

void Kit_TruthSwapAdjacentVars_64bit(word *pInOut,int nVars,int iVar)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  word *__src;
  ulong uVar8;
  int iVar9;
  size_t __n;
  undefined1 local_838 [2056];
  
  uVar4 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  if (nVars + -1 <= iVar) {
    __assert_fail("iVar < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/lucky/luckySwap.c"
                  ,0x9a,"void Kit_TruthSwapAdjacentVars_64bit(word *, int, int)");
  }
  if (iVar < 5) {
    if (0 < (int)uVar4) {
      uVar7 = Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][0];
      uVar1 = Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][1];
      uVar2 = Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][2];
      uVar8 = 0;
      do {
        uVar3 = pInOut[uVar8];
        bVar6 = (byte)(1 << ((byte)iVar & 0x1f));
        pInOut[uVar8] =
             (uVar3 & uVar2) >> (bVar6 & 0x3f) | (uVar1 & uVar3) << (bVar6 & 0x3f) | uVar7 & uVar3;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  else if (iVar == 5) {
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        uVar1 = pInOut[uVar7 + 1];
        pInOut[uVar7 + 1] = (uVar1 << 0x20 ^ pInOut[uVar7]) >> 0x20 ^ uVar1;
        *(int *)((long)pInOut + uVar7 * 8 + 4) = (int)uVar1;
        uVar7 = uVar7 + 2;
      } while (uVar7 < uVar4);
    }
  }
  else {
    bVar6 = (byte)iVar - 6;
    iVar9 = 2 << (bVar6 & 0x1f);
    if (iVar9 < (int)uVar4) {
      __src = pInOut + iVar9;
      __n = (size_t)(8 << (bVar6 & 0x1f));
      iVar5 = 4 << (bVar6 & 0x1f);
      do {
        memcpy(local_838,__src + -(long)(1 << (bVar6 & 0x1f)),__n);
        memcpy(__src + -(long)(1 << (bVar6 & 0x1f)),__src,__n);
        memcpy(__src,local_838,__n);
        iVar9 = iVar9 + iVar5;
        __src = __src + iVar5;
      } while (iVar9 < (int)uVar4);
    }
  }
  return;
}

Assistant:

void Kit_TruthSwapAdjacentVars_64bit( word * pInOut, int nVars, int iVar )
{
    int i, Step, Shift, SizeOfBlock;                   //
    word temp[256];                   // to make only pInOut possible
    static word PMasks[5][3] = {
        { ABC_CONST(0x9999999999999999), ABC_CONST(0x2222222222222222), ABC_CONST(0x4444444444444444) },
        { ABC_CONST(0xC3C3C3C3C3C3C3C3), ABC_CONST(0x0C0C0C0C0C0C0C0C), ABC_CONST(0x3030303030303030) },
        { ABC_CONST(0xF00FF00FF00FF00F), ABC_CONST(0x00F000F000F000F0), ABC_CONST(0x0F000F000F000F00) },
        { ABC_CONST(0xFF0000FFFF0000FF), ABC_CONST(0x0000FF000000FF00), ABC_CONST(0x00FF000000FF0000) },
        { ABC_CONST(0xFFFF00000000FFFF), ABC_CONST(0x00000000FFFF0000), ABC_CONST(0x0000FFFF00000000) }
    };
    int nWords = Kit_TruthWordNum_64bit( nVars ); 
    
    assert( iVar < nVars - 1 );
    if ( iVar < 5 )
    {
        Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pInOut[i] = (pInOut[i] & PMasks[iVar][0]) | ((pInOut[i] & PMasks[iVar][1]) << Shift) | ((pInOut[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 5 )
    {
        Step = 1 << (iVar - 6);
        SizeOfBlock = sizeof(word)*Step;
        pInOut += 2*Step;
        for(i=2*Step; i<nWords; i+=4*Step)
        {           
            memcpy(temp,pInOut-Step,(size_t)SizeOfBlock);
            memcpy(pInOut-Step,pInOut,(size_t)SizeOfBlock);
            memcpy(pInOut,temp,(size_t)SizeOfBlock);
            pInOut += 4*Step;
        }
    }
    else // if ( iVar == 5 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            temp[0] = pInOut[i+1] << 32;
            pInOut[i+1] ^= (temp[0] ^ pInOut[i]) >> 32;
            pInOut[i] = (pInOut[i] & 0x00000000FFFFFFFF) | temp[0];
            
        }
    }
}